

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

int __thiscall
phmap::priv::
base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
::verify(base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
         *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  _Rb_tree_header *p_Var1;
  int extraout_EAX;
  reference x;
  reference x_00;
  long lVar2;
  _Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_> _Var3;
  int iVar4;
  char *pcVar5;
  const_iterator cVar6;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
  tree_iter;
  AssertionResult gtest_ar_3;
  const_reverse_iterator tree_riter;
  reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>_>
  local_90;
  AssertHelper local_80;
  const_iterator checker_iter;
  AssertionResult gtest_ar;
  const_reverse_iterator checker_riter;
  reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  local_48;
  undefined8 uStack_40;
  
  btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
  ::verify((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
            *)this,ctx,sig,siglen,tbs,tbslen);
  tree_riter.current.node =
       (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
        *)(this->tree_).
          super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
          .
          super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
          .
          super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
          .tree_.size_;
  gtest_ar_3._0_8_ = (this->checker_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"tree_.size()","checker_.size()",(unsigned_long *)&tree_riter,
             (unsigned_long *)&gtest_ar_3);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&tree_riter);
    if ((undefined8 *)
        CONCAT44(gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._4_4_,
                 (int)gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT44(gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_,
                                  (int)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x112,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&tree_riter);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    if (tree_riter.current.node !=
        (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
         *)0x0) {
      (**(code **)(*(long *)tree_riter.current.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  checker_iter._M_node = (this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cVar6 = btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
          ::begin((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                   *)this);
  gtest_ar.success_ = cVar6.node._0_1_;
  gtest_ar._1_7_ = cVar6.node._1_7_;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = cVar6.position;
  while( true ) {
    cVar6 = btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
            ::end((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                   *)this);
    if (((btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
          *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) == cVar6.node) &&
       ((int)gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl == cVar6.position)) break;
    x = btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
        ::operator*((btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
                     *)&gtest_ar);
    (anonymous_namespace)::
    CheckPairEquals<std::pair<int,int>const,std::pair<int,int>,std::pair<int,int>const,std::pair<int,int>>
              (x,(pair<const_std::pair<int,_int>,_std::pair<int,_int>_> *)(checker_iter._M_node + 1)
              );
    btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
    ::increment((btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
                 *)&gtest_ar);
    checker_iter._M_node = (_Base_ptr)std::_Rb_tree_increment(checker_iter._M_node);
  }
  for (iVar4 = (int)(this->tree_).
                    super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                    .
                    super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                    .
                    super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                    .tree_.size_; 0 < iVar4; iVar4 = iVar4 + -1) {
    tree_iter.node._1_7_ = gtest_ar._1_7_;
    tree_iter.node._0_1_ = gtest_ar.success_;
    tree_iter.position =
         (int)gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
    tree_iter._12_4_ = 0;
    base_checker<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>,std::multimap<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>
    ::
    iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>const,std::pair<std::pair<int,int>const,std::pair<int,int>>const&,std::pair<std::pair<int,int>const,std::pair<int,int>>const*>,std::_Rb_tree_const_iterator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>
              ((base_checker<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>,std::multimap<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>
                *)this,tree_iter,
               (_Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>
               )checker_iter._M_node);
    btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
    ::decrement((btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
                 *)&gtest_ar);
    checker_iter._M_node = (_Base_ptr)std::_Rb_tree_decrement(checker_iter._M_node);
  }
  cVar6 = btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
          ::begin((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                   *)this);
  gtest_ar_3._0_8_ = cVar6.node;
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = cVar6.position;
  testing::internal::
  CmpHelperEQ<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>const,std::pair<std::pair<int,int>const,std::pair<int,int>>const&,std::pair<std::pair<int,int>const,std::pair<int,int>>const*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>const,std::pair<std::pair<int,int>const,std::pair<int,int>>const&,std::pair<std::pair<int,int>const,std::pair<int,int>>const*>>
            ((internal *)&tree_riter,"tree_iter","tree_.begin()",
             (btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
              *)&gtest_ar,
             (btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
              *)&gtest_ar_3);
  if ((char)tree_riter.current.node == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if ((undefined8 *)CONCAT44(tree_riter.current._12_4_,tree_riter.current.position) ==
        (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT44(tree_riter.current._12_4_,tree_riter.current.position);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x121,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (gtest_ar_3._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&tree_riter.current.position);
  gtest_ar_3._0_8_ = (this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_const_iterator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,std::_Rb_tree_const_iterator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>
            ((internal *)&tree_riter,"checker_iter","checker_.begin()",&checker_iter,
             (_Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_> *
             )&gtest_ar_3);
  if ((char)tree_riter.current.node == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if ((undefined8 *)CONCAT44(tree_riter.current._12_4_,tree_riter.current.position) ==
        (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT44(tree_riter.current._12_4_,tree_riter.current.position);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x122,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (gtest_ar_3._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&tree_riter.current.position);
  p_Var1 = &(this->checker_)._M_t._M_impl.super__Rb_tree_header;
  checker_riter.current._M_node =
       (_Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>)
       (_Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>)p_Var1;
  cVar6 = btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
          ::end((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                 *)this);
  tree_riter.current.node = cVar6.node;
  tree_riter.current.position = cVar6.position;
  _Var3._M_node = &p_Var1->_M_header;
  while( true ) {
    cVar6 = btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
            ::begin((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                     *)this);
    if ((tree_riter.current.node == cVar6.node) && (tree_riter.current.position == cVar6.position))
    break;
    x_00 = std::
           reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>_>
           ::operator*((reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>_>
                        *)&tree_riter.current);
    lVar2 = std::_Rb_tree_decrement(_Var3._M_node);
    (anonymous_namespace)::
    CheckPairEquals<std::pair<int,int>const,std::pair<int,int>,std::pair<int,int>const,std::pair<int,int>>
              (x_00,(pair<const_std::pair<int,_int>,_std::pair<int,_int>_> *)(lVar2 + 0x20));
    btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
    ::decrement(&tree_riter.current);
    _Var3._M_node = (_Base_ptr)std::_Rb_tree_decrement(_Var3._M_node);
    checker_riter.current._M_node =
         (_Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>)
         (_Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>)
         _Var3._M_node;
  }
  for (iVar4 = (int)(this->tree_).
                    super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                    .
                    super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                    .
                    super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                    .tree_.size_; 0 < iVar4; iVar4 = iVar4 + -1) {
    uStack_40 = CONCAT44(tree_riter.current._12_4_,tree_riter.current.position);
    local_48.current._M_node =
         (_Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>)
         (_Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>)
         tree_riter.current.node;
    base_checker<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>,std::multimap<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>
    ::
    riter_check<std::reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>const,std::pair<std::pair<int,int>const,std::pair<int,int>>const&,std::pair<std::pair<int,int>const,std::pair<int,int>>const*>>,std::reverse_iterator<std::_Rb_tree_const_iterator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>
              ((base_checker<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>,std::multimap<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>
                *)&gtest_ar_3,
               (reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>_>
                *)this,&local_48);
    btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_const_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
    ::increment(&tree_riter.current);
    _Var3._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var3._M_node);
    checker_riter.current._M_node =
         (_Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>)
         (_Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>)
         _Var3._M_node;
  }
  cVar6 = btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
          ::end((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                 *)this);
  local_90.current.node = cVar6.node;
  local_90.current.position = cVar6.position;
  testing::internal::
  CmpHelperEQ<std::reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>const,std::pair<std::pair<int,int>const,std::pair<int,int>>const&,std::pair<std::pair<int,int>const,std::pair<int,int>>const*>>,std::reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>const,std::pair<std::pair<int,int>const,std::pair<int,int>>const&,std::pair<std::pair<int,int>const,std::pair<int,int>>const*>>>
            ((internal *)&gtest_ar_3,"tree_riter","tree_.rbegin()",&tree_riter,&local_90);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if ((undefined8 *)
        CONCAT44(gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._4_4_,
                 (int)gtest_ar_3.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT44(gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_,
                                  (int)gtest_ar_3.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x131,pcVar5);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_90.current.node !=
        (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
         *)0x0) {
      (**(code **)(*(long *)local_90.current.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  local_90.current.node =
       (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
        *)p_Var1;
  testing::internal::
  CmpHelperEQ<std::reverse_iterator<std::_Rb_tree_const_iterator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>,std::reverse_iterator<std::_Rb_tree_const_iterator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>
            ((internal *)&gtest_ar_3,"checker_riter","checker_.rbegin()",&checker_riter,
             (reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              *)&local_90);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if ((undefined8 *)
        CONCAT44(gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._4_4_,
                 (int)gtest_ar_3.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT44(gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_,
                                  (int)gtest_ar_3.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x132,pcVar5);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_90.current.node !=
        (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
         *)0x0) {
      (**(code **)(*(long *)local_90.current.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  return extraout_EAX;
}

Assistant:

void verify() const {
        tree_.verify();
        EXPECT_EQ(tree_.size(), checker_.size());

        // Move through the forward iterators using increment.
        auto checker_iter = checker_.begin();
        const_iterator tree_iter(tree_.begin());
        for (; tree_iter != tree_.end(); ++tree_iter, ++checker_iter) {
            CheckPairEquals(*tree_iter, *checker_iter);
        }

        // Move through the forward iterators using decrement.
        for (int n = (int)tree_.size() - 1; n >= 0; --n) {
            iter_check(tree_iter, checker_iter);
            --tree_iter;
            --checker_iter;
        }
        EXPECT_EQ(tree_iter, tree_.begin());
        EXPECT_EQ(checker_iter, checker_.begin());

        // Move through the reverse iterators using increment.
        auto checker_riter = checker_.rbegin();
        const_reverse_iterator tree_riter(tree_.rbegin());
        for (; tree_riter != tree_.rend(); ++tree_riter, ++checker_riter) {
            CheckPairEquals(*tree_riter, *checker_riter);
        }

        // Move through the reverse iterators using decrement.
        for (int n = (int)tree_.size() - 1; n >= 0; --n) {
            riter_check(tree_riter, checker_riter);
            --tree_riter;
            --checker_riter;
        }
        EXPECT_EQ(tree_riter, tree_.rbegin());
        EXPECT_EQ(checker_riter, checker_.rbegin());
    }